

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * apply_multiplication_operation(Value *left_value,Value *right_value)

{
  ValueType VVar1;
  Value *pVVar2;
  longdouble lVar3;
  longdouble lVar4;
  
  VVar1 = left_value->value_type;
  if ((VVar1 == ValueTypeIntegerValue) && (right_value->value_type == ValueTypeIntegerValue)) {
    pVVar2 = new_integer_value(*(long *)(right_value + 1) * *(long *)(left_value + 1));
    return pVVar2;
  }
  if (((VVar1 & ~ValueTypeBoolValue) == ValueTypeIntegerValue) &&
     ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue)) {
    if (VVar1 == ValueTypeFloatValue) {
      lVar3 = *(longdouble *)&left_value[1].linked_variable_count;
    }
    else {
      lVar3 = (longdouble)*(long *)(left_value + 1);
    }
    if (right_value->value_type == ValueTypeFloatValue) {
      lVar4 = *(longdouble *)&right_value[1].linked_variable_count;
    }
    else {
      lVar4 = (longdouble)*(long *)(right_value + 1);
    }
    pVVar2 = new_float_value(lVar4 * lVar3);
    return pVVar2;
  }
  pVVar2 = new_null_value();
  return pVVar2;
}

Assistant:

Value *apply_multiplication_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_integer_value(((IntegerValue *) left_value)->integer_value * ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_float_value(left_float * right_float);
  }

  return new_null_value();
}